

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poisson.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  pointer pbVar4;
  char **ppcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char **ppcVar8;
  ostream *poVar9;
  void *__s;
  int *def_val;
  DefaultPRNG DVar10;
  int *piVar11;
  Point *p_1;
  _Alloc_hider _Var12;
  uint uVar13;
  uint uVar14;
  Point *p;
  float fVar15;
  Point center;
  Point center_00;
  DefaultPRNG PRNG;
  uint numPoints;
  vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> Points;
  parser cmdl;
  ofstream File;
  DefaultPRNG local_340;
  uint32_t local_33c;
  string local_338;
  char **local_318;
  parser local_310;
  undefined1 local_230 [8];
  char *local_228 [2];
  uint auStack_218 [24];
  ios_base local_1b8 [128];
  ios_base local_138 [264];
  
  PrintBanner();
  argh::parser::parser(&local_310,argv,1);
  pbVar4 = &local_310.empty_;
  if (0x20 < (ulong)((long)local_310.pos_args_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_310.pos_args_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    pbVar4 = local_310.pos_args_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  if (pbVar4->_M_string_length != 0) {
    pbVar4 = local_310.pos_args_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    if ((ulong)((long)local_310.pos_args_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_310.pos_args_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      pbVar4 = &local_310.empty_;
    }
    LoadDensityMap((pbVar4->_M_dataplus)._M_p);
  }
  local_230 = (undefined1  [8])0x1071ef;
  local_318 = std::
              __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>>
                        (local_230,local_228,&local_310);
  local_230 = (undefined1  [8])0x1071fc;
  ppcVar5 = std::
            __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>>
                      (local_230,local_228,&local_310);
  local_230 = (undefined1  [8])0x107205;
  ppcVar6 = std::
            __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>>
                      (local_230,local_228,&local_310);
  local_230 = (undefined1  [8])0x107212;
  ppcVar7 = std::
            __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>>
                      (local_230,local_228,&local_310);
  local_230 = (undefined1  [8])0x107222;
  ppcVar8 = std::
            __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>>
                      (local_230,local_228,&local_310);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"num-points","");
  piVar11 = &kNumPointsDefaultJittered;
  if (ppcVar7 == local_228) {
    piVar11 = &kNumPointsDefaultPoisson;
  }
  def_val = &kNumPointsDefaultVogel;
  if (ppcVar6 == local_228) {
    def_val = piVar11;
  }
  argh::parser::operator()((string_stream *)local_230,&local_310,&local_338,def_val);
  std::istream::_M_extract<unsigned_int>((uint *)local_230);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_230);
  std::ios_base::~ios_base(local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"NumPoints = ",0xc);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  local_340.seed_ = 0x6cd7ef;
  if (ppcVar6 == local_228) {
    if (ppcVar7 == local_228) {
      if (ppcVar8 == local_228) {
        PoissonGenerator::generatePoissonPoints<PoissonGenerator::DefaultPRNG>
                  ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                   &local_338,local_33c,&local_340,ppcVar5 == local_228,0x1e,-1.0);
      }
      else {
        PoissonGenerator::generateHammersleyPoints
                  ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                   &local_338,local_33c);
      }
    }
    else {
      center_00._8_4_ = 1;
      center_00.x = 0.5;
      center_00.y = 0.5;
      PoissonGenerator::generateJitteredGridPoints<PoissonGenerator::DefaultPRNG>
                ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
                 &local_338,local_33c,&local_340,ppcVar5 == local_228,0.004,center_00);
    }
  }
  else {
    center._8_4_ = SUB84(def_val,0);
    center.x = 0.5;
    center.y = 0.5;
    PoissonGenerator::generateVogelPoints
              ((vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *)
               &local_338,local_33c,true,0.0,center);
  }
  __s = operator_new__(0xc0000);
  memset(__s,0,0xc0000);
  pfVar3 = g_DensityMap;
  DVar10.seed_ = local_340.seed_;
  for (_Var12._M_p = local_338._M_dataplus._M_p; _Var12._M_p != (pointer)local_338._M_string_length;
      _Var12._M_p = _Var12._M_p + 0xc) {
    uVar13 = (uint)(*(float *)_Var12._M_p * 512.0);
    uVar14 = (uint)(*(float *)((long)_Var12._M_p + 4) * 512.0);
    if ((uVar14 < 0x200 && uVar13 < 0x200) &&
       ((pfVar3 == (float *)0x0 ||
        (DVar10.seed_ = DVar10.seed_ * 0x7f3cf,
        fVar15 = ((float)(DVar10.seed_ & 0x7fffff | 0x40000000) + -2.0) * 0.5,
        pfVar1 = pfVar3 + (uVar14 << 9 | uVar13), local_340.seed_ = DVar10.seed_,
        fVar15 < *pfVar1 || fVar15 == *pfVar1)))) {
      lVar2 = (ulong)(uVar14 << 9 | uVar13) * 3;
      *(undefined1 *)((long)__s + lVar2 + 2) = 0xff;
      *(undefined2 *)((long)__s + lVar2) = 0xffff;
    }
  }
  SaveBMP("Points.bmp",__s,0x200,0x200);
  operator_delete__(__s);
  std::ofstream::ofstream(local_230,"points.txt",_S_out);
  if (local_318 == local_228) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"const vec2 points[",0x12);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"{",1);
    std::ios::widen((char)(ostream *)local_230 + (char)*(undefined8 *)((long)local_230 + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
    *(uint *)((long)auStack_218 + *(long *)((long)local_230 + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)((long)local_230 + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)((long)local_228 + *(long *)((long)local_230 + -0x18)) = 6;
    if (local_338._M_dataplus._M_p != (pointer)local_338._M_string_length) {
      _Var12._M_p = local_338._M_dataplus._M_p;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\tvec2(",6);
        poVar9 = std::ostream::_M_insert<double>((double)*(float *)_Var12._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"f, ",3);
        poVar9 = std::ostream::_M_insert<double>((double)*(float *)((long)_Var12._M_p + 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"f),",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        _Var12._M_p = _Var12._M_p + 0xc;
      } while (_Var12._M_p != (pointer)local_338._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"};",2);
    std::ios::widen((char)(ostream *)local_230 + (char)*(undefined8 *)((long)local_230 + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"NumPoints = ",0xc);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    for (_Var12._M_p = local_338._M_dataplus._M_p;
        _Var12._M_p != (pointer)local_338._M_string_length; _Var12._M_p = _Var12._M_p + 0xc) {
      poVar9 = std::ostream::_M_insert<double>((double)*(float *)_Var12._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      poVar9 = std::ostream::_M_insert<double>((double)*(float *)((long)_Var12._M_p + 4));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)((long)local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf((filebuf *)local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.empty_._M_dataplus._M_p != &local_310.empty_.field_2) {
    operator_delete(local_310.empty_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_310.registeredParams_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_310.flags_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_310.pos_args_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_310.params_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_310.args_);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  PrintBanner();

  argh::parser cmdl(argv);

  if (!cmdl[1].empty()) {
    LoadDensityMap(cmdl[1].c_str());
  }

  const bool cmdRawPointsOutput = cmdl[{"--raw-points"}];
  const bool cmdSquare = cmdl[{"--square"}];
  const bool cmdVogelDisk = cmdl[{"--vogel-disk"}];
  const bool cmdJitteredGrid = cmdl[{"--jittered-grid"}];
  ;
  const bool cmdHammersley = cmdl[{"--hammersley"}];
  ;

  unsigned int numPoints;
  cmdl("num-points", cmdVogelDisk ? kNumPointsDefaultVogel : (cmdJitteredGrid ? kNumPointsDefaultJittered : kNumPointsDefaultPoisson)) >>
      numPoints;

  std::cout << "NumPoints = " << numPoints << std::endl;

  PoissonGenerator::DefaultPRNG PRNG;

  const auto Points = cmdVogelDisk      ? PoissonGenerator::generateVogelPoints(numPoints)
                      : cmdJitteredGrid ? PoissonGenerator::generateJitteredGridPoints(numPoints, PRNG, !cmdSquare)
                      : cmdHammersley   ? PoissonGenerator::generateHammersleyPoints(numPoints)
                                        : PoissonGenerator::generatePoissonPoints(numPoints, PRNG, !cmdSquare);

  // prepare BGR image
  const size_t DataSize = 3 * kImageSize * kImageSize;

  unsigned char* Img = new unsigned char[DataSize];

  memset(Img, 0, DataSize);

  for (auto i = Points.begin(); i != Points.end(); i++) {
    int x = int(i->x * kImageSize);
    int y = int(i->y * kImageSize);
    if (x < 0 || y < 0 || x >= kImageSize || y >= kImageSize)
      continue;
    if (g_DensityMap) {
      // dice
      float R = PRNG.randomFloat();
      float P = g_DensityMap[x + y * kImageSize];
      if (R > P)
        continue;
    }
    int Base = 3 * (x + y * kImageSize);
    Img[Base + 0] = Img[Base + 1] = Img[Base + 2] = 255;
  }

  SaveBMP("Points.bmp", Img, kImageSize, kImageSize);

  delete[] (Img);

  // dump points to a text file
  std::ofstream File("points.txt", std::ios::out);

  if (cmdRawPointsOutput) {
    File << "NumPoints = " << Points.size() << std::endl;

    for (const auto& p : Points) {
      File << p.x << " " << p.y << std::endl;
    }
  } else {
    File << "const vec2 points[" << Points.size() << "]" << std::endl;
    File << "{" << std::endl;
    File << std::fixed << std::setprecision(6);
    for (const auto& p : Points) {
      File << "\tvec2(" << p.x << "f, " << p.y << "f)," << std::endl;
    }
    File << "};" << std::endl;
  }

  return 0;
}